

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::listdemos(int cn)

{
  long lVar1;
  long lVar2;
  packetbuf p;
  packetbuf local_48;
  
  local_48.super_ucharbuf.buf = (uchar *)0x0;
  local_48.super_ucharbuf.len = 0;
  local_48.super_ucharbuf.maxlen = 0;
  local_48.super_ucharbuf.flags = '\0';
  local_48.growth = 5000;
  local_48.packet = enet_packet_create((void *)0x0,5000,1);
  local_48.super_ucharbuf.buf = (local_48.packet)->data;
  local_48.super_ucharbuf.maxlen = (int)(local_48.packet)->dataLength;
  putint(&local_48,0x48);
  putint(&local_48,DAT_00194d14);
  if (0 < DAT_00194d14) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      sendstring((char *)(demos + lVar2),&local_48);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x118;
    } while (lVar1 < DAT_00194d14);
  }
  enet_packet_resize(local_48.packet,(long)local_48.super_ucharbuf.len);
  local_48.super_ucharbuf.buf = (local_48.packet)->data;
  local_48.super_ucharbuf.maxlen = (int)(local_48.packet)->dataLength;
  sendpacket(cn,1,local_48.packet,-1);
  if (((0 < local_48.growth) && (local_48.packet != (ENetPacket *)0x0)) &&
     ((local_48.packet)->referenceCount == 0)) {
    enet_packet_destroy(local_48.packet);
  }
  return;
}

Assistant:

void listdemos(int cn)
    {
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SENDDEMOLIST);
        putint(p, demos.length());
        loopv(demos) sendstring(demos[i].info, p);
        sendpacket(cn, 1, p.finalize());
    }